

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O2

char * downlevel(char *filename)

{
  int iVar1;
  char *pcVar3;
  size_t sVar2;
  
  pcVar3 = pathname;
  if (pathname == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    sVar2 = strlen(pathname);
    iVar1 = (int)sVar2;
  }
  sVar2 = strlen(filename);
  if (iVar1 == 0) {
    pathname = (char *)malloc((long)((int)sVar2 + 1));
    if (pathname != (char *)0x0) {
      pcVar3 = strcpy(pathname,filename);
      return pcVar3;
    }
  }
  else {
    pcVar3 = (char *)realloc(pcVar3,(long)((int)sVar2 + iVar1 + 2));
    pathname = pcVar3;
    if (pcVar3 != (char *)0x0) {
      sVar2 = strlen(pcVar3);
      (pcVar3 + sVar2)[0] = '/';
      (pcVar3 + sVar2)[1] = '\0';
      pcVar3 = strcat(pcVar3,filename);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

char *
downlevel(char *filename)
{
	register int len, flen;

	if (!pathname)
		len = 0;
	else
		len = strlen(pathname);

	flen = strlen(filename);
	if (!len)
	{
		pathname = malloc(flen + 1);
		if (pathname)
			strcpy(pathname, filename);
	}
	else
	{
		pathname = realloc(pathname, len + flen + 2);
		if (pathname)
		{
			strcat(pathname, PATHSEPSTR);
			strcat(pathname, filename);
		}
	}
	return (pathname);
}